

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBar::mouseMoveEvent(QMenuBar *this,QMouseEvent *e)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QMenuBarPrivate *this_00;
  QAction *pQVar4;
  QPoint in_RDI;
  long in_FS_OFFSET;
  QPointF QVar5;
  QAction *action;
  bool popupState;
  QMenuBarPrivate *d;
  QAction *in_stack_00000048;
  MouseButton in_stack_ffffffffffffff9c;
  QSinglePointEvent *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar6;
  QPointF *in_stack_ffffffffffffffb0;
  QMenuBarPrivate *in_stack_ffffffffffffffb8;
  undefined2 uVar7;
  QMenuBarPrivate *this_01;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMenuBar *)0x65dbda);
  QSinglePointEvent::buttons(in_stack_ffffffffffffffa0);
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
  if (bVar1) {
    this_00->field_0x298 = this_00->field_0x298 & 0xfe;
    iVar3 = QMouseEvent::source();
    if (iVar3 != 0) goto LAB_0065dcfb;
  }
  bVar1 = true;
  if ((this_00->field_0x2a0 & 1) == 0) {
    bVar1 = (this_00->field_0x298 & 1) != 0;
  }
  uVar6 = bVar1;
  QVar5 = QSinglePointEvent::position((QSinglePointEvent *)0x65dc90);
  this_01 = (QMenuBarPrivate *)QVar5.xp;
  QPointF::toPoint(in_stack_ffffffffffffffb0);
  pQVar4 = QMenuBarPrivate::actionAt(in_stack_ffffffffffffffb8,in_RDI);
  uVar7 = in_RDI.yp.m_i._2_2_;
  if (((pQVar4 != (QAction *)0x0) &&
      (bVar2 = QMenuBarPrivate::isVisible
                         (this_00,(QAction *)CONCAT17(uVar6,in_stack_ffffffffffffffa8)), bVar2)) ||
     (bVar1 == false)) {
    QMenuBarPrivate::setCurrentAction
              (this_01,in_stack_00000048,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
  }
LAB_0065dcfb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (!(e->buttons() & Qt::LeftButton)) {
        d->mouseDown = false;
        // We receive mouse move and mouse press on touch.
        // Mouse move will open the menu and mouse press
        // will close it, so ignore mouse move.
        if (e->source() != Qt::MouseEventNotSynthesized)
            return;
    }

    bool popupState = d->popupState || d->mouseDown;
    QAction *action = d->actionAt(e->position().toPoint());
    if ((action && d->isVisible(action)) || !popupState)
        d->setCurrentAction(action, popupState);
}